

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O0

h__Writer * __thiscall
ASDCP::ATMOS::MXFWriter::h__Writer::SetSourceStream
          (h__Writer *this,DCDataDescriptor *DDesc,byte_t *essenceCoding,string *packageLabel,
          string *defLabel)

{
  long lVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  string *WrappingUL;
  bool bVar7;
  int iVar8;
  ILogSink *this_00;
  byte_t *pbVar9;
  UL *in_R9;
  Rational local_198;
  UL local_188;
  UL local_168;
  string local_148;
  undefined1 local_128 [112];
  h__WriterState local_b8;
  ui32_t TCFrameRate;
  undefined1 local_39;
  UL *local_38;
  string *defLabel_local;
  string *packageLabel_local;
  byte_t *essenceCoding_local;
  DCDataDescriptor *DDesc_local;
  h__Writer *this_local;
  Result_t *result;
  
  local_38 = in_R9;
  defLabel_local = defLabel;
  packageLabel_local = packageLabel;
  essenceCoding_local = essenceCoding;
  DDesc_local = DDesc;
  this_local = this;
  bVar7 = MXF::h__WriterState::Test_INIT((h__WriterState *)(DDesc + 0x14));
  if (bVar7) {
    bVar7 = Rational::operator!=((Rational *)essenceCoding_local,(Rational *)&ASDCP::EditRate_24);
    if (((((bVar7) &&
          (bVar7 = Rational::operator!=
                             ((Rational *)essenceCoding_local,(Rational *)&ASDCP::EditRate_25),
          bVar7)) &&
         (bVar7 = Rational::operator!=
                            ((Rational *)essenceCoding_local,(Rational *)&ASDCP::EditRate_30), bVar7
         )) && ((((bVar7 = Rational::operator!=
                                     ((Rational *)essenceCoding_local,
                                      (Rational *)&ASDCP::EditRate_48), bVar7 &&
                  (bVar7 = Rational::operator!=
                                     ((Rational *)essenceCoding_local,
                                      (Rational *)&ASDCP::EditRate_50), bVar7)) &&
                 ((bVar7 = Rational::operator!=
                                     ((Rational *)essenceCoding_local,
                                      (Rational *)&ASDCP::EditRate_60), bVar7 &&
                  ((bVar7 = Rational::operator!=
                                      ((Rational *)essenceCoding_local,
                                       (Rational *)&ASDCP::EditRate_96), bVar7 &&
                   (bVar7 = Rational::operator!=
                                      ((Rational *)essenceCoding_local,
                                       (Rational *)&ASDCP::EditRate_100), bVar7)))))) &&
                (bVar7 = Rational::operator!=
                                   ((Rational *)essenceCoding_local,(Rational *)&ASDCP::EditRate_120
                                   ), bVar7)))) &&
       (((bVar7 = Rational::operator!=
                            ((Rational *)essenceCoding_local,(Rational *)&ASDCP::EditRate_192),
         bVar7 && (bVar7 = Rational::operator!=
                                     ((Rational *)essenceCoding_local,
                                      (Rational *)&ASDCP::EditRate_200), bVar7)) &&
        (bVar7 = Rational::operator!=
                           ((Rational *)essenceCoding_local,(Rational *)&ASDCP::EditRate_240), bVar7
        )))) {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error
                (this_00,"DCDataDescriptor.EditRate is not a supported value: %d/%d\n",
                 (ulong)*(uint *)essenceCoding_local,(ulong)*(uint *)(essenceCoding_local + 4));
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_RAW_FORMAT);
    }
    else {
      lVar1._0_4_ = DDesc->ContainerDuration;
      lVar1._4_1_ = DDesc->AssetID[0];
      lVar1._5_1_ = DDesc->AssetID[1];
      lVar1._6_1_ = DDesc->AssetID[2];
      lVar1._7_1_ = DDesc->AssetID[3];
      if (lVar1 == 0) {
        __assert_fail("m_Dict",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_ATMOS.cpp"
                      ,0x20a,
                      "ASDCP::Result_t ASDCP::ATMOS::MXFWriter::h__Writer::SetSourceStream(const ASDCP::DCData::DCDataDescriptor &, const byte_t *, const std::string &, const std::string &)"
                     );
      }
      memcpy(DDesc[0x28].AssetID + 4,essenceCoding_local,0x2c);
      if (packageLabel_local != (string *)0x0) {
        DDesc[0x29].EditRate = *(Rational *)packageLabel_local;
        uVar3 = *(undefined1 *)((long)&packageLabel_local->_M_string_length + 4);
        uVar4 = *(undefined1 *)((long)&packageLabel_local->_M_string_length + 5);
        uVar5 = *(undefined1 *)((long)&packageLabel_local->_M_string_length + 6);
        uVar6 = *(undefined1 *)((long)&packageLabel_local->_M_string_length + 7);
        DDesc[0x29].ContainerDuration = *(undefined4 *)&packageLabel_local->_M_string_length;
        DDesc[0x29].AssetID[0] = uVar3;
        DDesc[0x29].AssetID[1] = uVar4;
        DDesc[0x29].AssetID[2] = uVar5;
        DDesc[0x29].AssetID[3] = uVar6;
      }
      local_39 = 0;
      DCData_DDesc_to_MD(this,DDesc);
      iVar8 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if (-1 < iVar8) {
        pbVar9 = Dictionary::ul(*(Dictionary **)&DDesc->ContainerDuration,MDD_PrivateDCDataEssence);
        uVar2 = *(undefined8 *)(pbVar9 + 8);
        *(undefined8 *)(DDesc[0x29].AssetID + 4) = *(undefined8 *)pbVar9;
        *(undefined8 *)(DDesc[0x29].AssetID + 0xc) = uVar2;
        DDesc[0x29].DataEssenceCoding[3] = '\x01';
        MXF::h__WriterState::Goto_READY(&local_b8);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_b8);
        Kumu::Result_t::~Result_t((Result_t *)&local_b8);
      }
      iVar8 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      WrappingUL = defLabel_local;
      if (-1 < iVar8) {
        local_128._108_4_ = *(undefined4 *)(DDesc[0x28].AssetID + 4);
        pbVar9 = Dictionary::ul(*(Dictionary **)&DDesc->ContainerDuration,
                                MDD_PrivateDCDataWrappingFrame);
        UL::UL((UL *)&local_148,pbVar9);
        UL::UL(&local_168,DDesc[0x29].AssetID + 4);
        pbVar9 = Dictionary::ul(*(Dictionary **)&DDesc->ContainerDuration,MDD_DataDataDef);
        UL::UL(&local_188,pbVar9);
        MXF::Rational::Rational(&local_198,(Rational *)(DDesc[0x28].AssetID + 4));
        h__ASDCPWriter::WriteASDCPHeader
                  ((h__ASDCPWriter *)local_128,(string *)DDesc,(UL *)WrappingUL,&local_148,local_38,
                   &local_168,(Rational *)&local_188,(ui32_t)&local_198,local_128._108_4_);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_128);
        Kumu::Result_t::~Result_t((Result_t *)local_128);
        MXF::Rational::~Rational(&local_198);
        UL::~UL(&local_188);
        UL::~UL(&local_168);
        UL::~UL((UL *)&local_148);
      }
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::ATMOS::MXFWriter::h__Writer::SetSourceStream(ASDCP::DCData::DCDataDescriptor const& DDesc,
						    const byte_t * essenceCoding,
						    const std::string& packageLabel,
						    const std::string& defLabel)
{
  if ( ! m_State.Test_INIT() )
    return RESULT_STATE;

  if ( DDesc.EditRate != EditRate_24
       && DDesc.EditRate != EditRate_25
       && DDesc.EditRate != EditRate_30
       && DDesc.EditRate != EditRate_48
       && DDesc.EditRate != EditRate_50
       && DDesc.EditRate != EditRate_60
       && DDesc.EditRate != EditRate_96
       && DDesc.EditRate != EditRate_100
       && DDesc.EditRate != EditRate_120
       && DDesc.EditRate != EditRate_192
       && DDesc.EditRate != EditRate_200
       && DDesc.EditRate != EditRate_240 )
  {
    DefaultLogSink().Error("DCDataDescriptor.EditRate is not a supported value: %d/%d\n",
                           DDesc.EditRate.Numerator, DDesc.EditRate.Denominator);
    return RESULT_RAW_FORMAT;
  }

  assert(m_Dict);
  m_DDesc = DDesc;
  if (NULL != essenceCoding)
      memcpy(m_DDesc.DataEssenceCoding, essenceCoding, SMPTE_UL_LENGTH);
  Result_t result = DCData_DDesc_to_MD(m_DDesc);

  if ( ASDCP_SUCCESS(result) )
  {
    memcpy(m_EssenceUL, m_Dict->ul(MDD_PrivateDCDataEssence), SMPTE_UL_LENGTH);
    m_EssenceUL[SMPTE_UL_LENGTH-1] = 1; // first (and only) essence container
    result = m_State.Goto_READY();
  }

  if ( ASDCP_SUCCESS(result) )
  {
    ui32_t TCFrameRate = m_DDesc.EditRate.Numerator;

    result = WriteASDCPHeader(packageLabel, UL(m_Dict->ul(MDD_PrivateDCDataWrappingFrame)),
			      defLabel, UL(m_EssenceUL), UL(m_Dict->ul(MDD_DataDataDef)),
			      m_DDesc.EditRate, TCFrameRate);
  }

  return result;
}